

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestStreamingImpl::doStreamI(TestStreamingImpl *this,DoStreamIContext context)

{
  PromiseFulfiller<void> **__return_storage_ptr__;
  SourceLocation location;
  uint32_t uVar1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *t;
  Promise<void> *pPVar2;
  TestStreamingImpl *this_00;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_98;
  SourceLocation local_80;
  undefined1 local_68 [8];
  PromiseFulfillerPair<void> paf;
  TestStreamingImpl *this_local;
  DoStreamIContext context_local;
  
  __return_storage_ptr__ = &paf.fulfiller.ptr;
  this_00 = this;
  context_local.hook = (CallContextHook *)this;
  StreamingCallContext<capnproto_test::capnp::test::TestStreaming::DoStreamIParams>::getParams
            ((Reader *)__return_storage_ptr__,
             (StreamingCallContext<capnproto_test::capnp::test::TestStreaming::DoStreamIParams> *)
             &this_local);
  uVar1 = capnproto_test::capnp::test::TestStreaming::DoStreamIParams::Reader::getI
                    ((Reader *)__return_storage_ptr__);
  *(uint32_t *)&context.hook[1]._vptr_CallContextHook =
       *(int *)&context.hook[1]._vptr_CallContextHook + uVar1;
  kj::SourceLocation::SourceLocation
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,"doStreamI",0x158,0x10);
  location.function = (char *)local_80._16_8_;
  location.fileName = local_80.function;
  location._16_8_ = this_00;
  kj::newPromiseAndFulfiller<void>(location);
  t = kj::mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(&local_98,t);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
            ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(context.hook + 2),
             &local_98);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_98);
  pPVar2 = kj::mv<kj::Promise<void>>((Promise<void> *)local_68);
  kj::Promise<void>::Promise((Promise<void> *)this_00,pPVar2);
  kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_68);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> doStreamI(DoStreamIContext context) override {
    iSum += context.getParams().getI();
    auto paf = kj::newPromiseAndFulfiller<void>();
    fulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }